

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall
despot::Parser::GetNoisyNextState
          (Parser *this,vector<int,_std::allocator<int>_> *state,ACT_TYPE action,double *random)

{
  pointer piVar1;
  CPT *pCVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  int *piVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  
  piVar1 = (state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  lVar5 = (long)(state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar1;
  if (lVar5 != 0) {
    lVar5 = lVar5 >> 2;
    piVar6 = &(((this->prev_state_vars_).
                super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
                super__Vector_impl_data._M_start)->super_NamedVar).super_Variable.curr_value;
    lVar7 = 0;
    do {
      *piVar6 = piVar1[lVar7];
      lVar7 = lVar7 + 1;
      piVar6 = piVar6 + 0x30;
    } while (lVar5 + (ulong)(lVar5 == 0) != lVar7);
  }
  (((this->action_vars_).super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>.
    _M_impl.super__Vector_impl_data._M_start)->super_Variable).curr_value = action;
  if ((state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish !=
      (state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar4 = (ulong)action;
    uVar8 = uVar4 + 0x3f;
    if (-1 < (long)uVar4) {
      uVar8 = uVar4;
    }
    lVar5 = 0;
    uVar9 = 0;
    do {
      if ((*(ulong *)((ulong)((uVar4 & 0x800000000000003f) < 0x8000000000000001) * 8 + -8 +
                     *(long *)((long)&(((this->is_identity_).
                                        super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                      super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                      _M_p + lVar5) + ((long)uVar8 >> 6) * 8) &
          1L << ((byte)action & 0x3f)) == 0) {
        pCVar2 = (this->noisy_transition_funcs_).
                 super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar9];
        iVar3 = (*(pCVar2->super_Function)._vptr_Function[0xe])(pCVar2,random);
        (state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start[uVar9] = iVar3;
      }
      uVar9 = uVar9 + 1;
      lVar5 = lVar5 + 0x28;
    } while (uVar9 < (ulong)((long)(state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)(state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start >> 2));
  }
  return;
}

Assistant:

void Parser::GetNoisyNextState(vector<int>& state, ACT_TYPE action,
	double& random) const {
	for (int s = 0; s < state.size(); s++) {
		prev_state_vars_[s].curr_value = state[s];
	}
	action_vars_[0].curr_value = action;

	for (int s = 0; s < state.size(); s++) {
		if (!is_identity_[s][action])
			state[s] = noisy_transition_funcs_[s]->ComputeCurrentIndex(random);
	}
}